

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineStackVarName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,Index index,Type type,string_view name)

{
  string_view name_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar1;
  undefined1 local_a4 [7];
  bool success;
  StackTypePair stp;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string_view local_48;
  undefined1 local_35;
  Index local_34;
  CWriter *pCStack_30;
  Index index_local;
  CWriter *this_local;
  string_view name_local;
  Type type_local;
  string *unique;
  
  name_local._M_len = (size_t)name._M_str;
  stp.second = (Type)name._M_len;
  local_35 = 0;
  name_00._M_str = (char *)type;
  name_00._M_len = name_local._M_len;
  local_34 = index;
  pCStack_30 = this;
  this_local = (CWriter *)stp.second;
  name_local._M_str = (char *)type;
  MangleName_abi_cxx11_(&local_88,(CWriter *)stp.second,name_00);
  std::operator+(&local_68,"var_",&local_88);
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
  anon_unknown_0::CWriter::FindUniqueName
            (__return_storage_ptr__,(CWriter *)this,(SymbolSet *)(this + 0x188),local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::pair<unsigned_int,_wabt::Type>::pair<unsigned_int_&,_wabt::Type_&,_true>
            ((pair<unsigned_int,_wabt::Type> *)local_a4,&local_34,(Type *)&name_local._M_str);
  pVar1 = std::
          map<std::pair<unsigned_int,wabt::Type>,std::__cxx11::string,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
          ::emplace<std::pair<unsigned_int,wabt::Type>&,std::__cxx11::string&>
                    ((map<std::pair<unsigned_int,wabt::Type>,std::__cxx11::string,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
                      *)(this + 0x128),(pair<unsigned_int,_wabt::Type> *)local_a4,
                     __return_storage_ptr__);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0x3fc,
                  "std::string wabt::(anonymous namespace)::CWriter::DefineStackVarName(Index, Type, std::string_view)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineStackVarName(Index index,
                                        Type type,
                                        std::string_view name) {
  std::string unique =
      FindUniqueName(local_syms_, kLocalSymbolPrefix + MangleName(name));
  StackTypePair stp = {index, type};
  [[maybe_unused]] bool success =
      stack_var_sym_map_.emplace(stp, unique).second;
  assert(success);
  return unique;
}